

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O3

int Bdc_DecomposeOr(Bdc_Man_t *p,Bdc_Isf_t *pIsf,Bdc_Isf_t *pIsfL,Bdc_Isf_t *pIsfR)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  uint *puVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint iVar;
  uint uVar14;
  long lVar15;
  uint *puVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  
  uVar8 = p->nWords;
  uVar11 = (ulong)uVar8;
  pVVar2 = p->vMemory;
  pIsfL->uSupp = 0;
  pIsfL->uUniq = 0;
  if (uVar11 == 0) {
    pIsfL->puOn = (uint *)0x0;
  }
  else {
    if ((int)uVar8 < 1) {
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x39a,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    lVar15 = (long)(int)uVar8 + (long)pVVar2->nSize;
    iVar10 = pVVar2->nCap;
    iVar17 = (int)lVar15;
    if (iVar10 < iVar17) {
      puVar16 = (uint *)0x0;
    }
    else {
      puVar16 = (uint *)(pVVar2->pArray + (lVar15 - uVar11));
    }
    pIsfL->puOn = puVar16;
    iVar17 = iVar17 + uVar8;
    pVVar2->nSize = iVar17;
    if (iVar17 <= iVar10) {
      piVar3 = pVVar2->pArray;
      pIsfL->puOff = (uint *)(piVar3 + ((long)iVar17 - uVar11));
      if (puVar16 != (uint *)0x0) {
        pIsfR->uSupp = 0;
        pIsfR->uUniq = 0;
        iVar17 = iVar17 + uVar8;
        puVar16 = (uint *)(piVar3 + ((long)iVar17 - uVar11));
        if (iVar10 < iVar17) {
          puVar16 = (uint *)0x0;
        }
        pIsfR->puOn = puVar16;
        iVar17 = iVar17 + uVar8;
        pVVar2->nSize = iVar17;
        if (iVar17 <= iVar10) {
          pIsfR->puOff = (uint *)(piVar3 + ((long)iVar17 - uVar11));
          uVar8 = Kit_TruthSupport(pIsf->puOn,p->nVars);
          uVar9 = Kit_TruthSupport(pIsf->puOff,p->nVars);
          if (uVar8 != uVar9) {
            __assert_fail("Kit_TruthSupport(pIsf->puOn, p->nVars) == Kit_TruthSupport(pIsf->puOff, p->nVars)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                          ,0x150,
                          "int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)")
            ;
          }
          uVar8 = pIsf->uSupp;
          uVar9 = Kit_TruthSupport(pIsf->puOn,p->nVars);
          if (uVar8 != uVar9) {
            __assert_fail("pIsf->uSupp == Kit_TruthSupport(pIsf->puOn, p->nVars)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                          ,0x151,
                          "int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)")
            ;
          }
          iVar10 = Bdc_DecomposeFindInitialVarSet(p,pIsf,pIsfL,pIsfR);
          if (iVar10 == 0) {
            iVar10 = Bdc_DecomposeWeakOr(p,pIsf,pIsfL,pIsfR);
            return iVar10;
          }
          Kit_TruthExistSet(p->puTemp1,pIsf->puOff,p->nVars,pIsfL->uUniq);
          Kit_TruthExistSet(p->puTemp2,pIsf->puOff,p->nVars,pIsfR->uUniq);
          iVar10 = p->nVars;
          if (iVar10 < 1) {
            uVar9 = 1;
            uVar8 = 1;
          }
          else {
            uVar14 = pIsfR->uUniq;
            uVar12 = pIsfL->uUniq;
            uVar1 = pIsf->uSupp;
            iVar = 0;
            uVar8 = 1;
            uVar9 = 1;
            do {
              uVar19 = 1 << ((byte)iVar & 0x1f);
              if (((~(uVar14 | uVar12) & uVar1) >> (iVar & 0x1f) & 1) != 0) {
                Kit_TruthExistNew(p->puTemp3,p->puTemp1,iVar10,iVar);
                Kit_TruthExistNew(p->puTemp4,p->puTemp2,p->nVars,iVar);
                uVar11 = (ulong)(uint)(1 << ((char)p->nVars - 5U & 0x1f));
                if (p->nVars < 6) {
                  uVar11 = 1;
                }
                puVar16 = pIsf->puOn;
                iVar10 = (int)uVar11;
                if ((int)uVar9 < (int)uVar8) {
                  puVar4 = p->puTemp2;
                  puVar5 = p->puTemp3;
                  uVar18 = uVar11;
                  do {
                    if ((int)uVar18 < 1) {
                      pIsfL->uUniq = pIsfL->uUniq | uVar19;
                      uVar9 = uVar9 + 1;
                      if (0 < iVar10) {
                        puVar16 = p->puTemp1;
                        uVar11 = uVar11 + 1;
                        do {
                          puVar16[uVar11 - 2] = puVar5[uVar11 - 2];
                          uVar11 = uVar11 - 1;
                        } while (1 < uVar11);
                      }
                      goto LAB_0054e1be;
                    }
                    lVar15 = uVar18 - 1;
                    lVar6 = uVar18 - 1;
                    lVar7 = uVar18 - 1;
                    uVar18 = uVar18 - 1;
                  } while ((puVar4[lVar7] & puVar5[lVar15] & puVar16[lVar6]) == 0);
                  puVar5 = p->puTemp4;
                  uVar18 = uVar11;
                  do {
                    if ((int)uVar18 < 1) {
                      pIsfR->uUniq = pIsfR->uUniq | uVar19;
                      uVar8 = uVar8 + 1;
                      if (0 < iVar10) {
                        uVar11 = uVar11 + 1;
                        do {
                          puVar4[uVar11 - 2] = puVar5[uVar11 - 2];
                          uVar11 = uVar11 - 1;
                        } while (1 < uVar11);
                      }
                      break;
                    }
                    lVar15 = uVar18 - 1;
                    lVar6 = uVar18 - 1;
                    lVar7 = uVar18 - 1;
                    uVar18 = uVar18 - 1;
                  } while ((p->puTemp1[lVar7] & puVar5[lVar15] & puVar16[lVar6]) == 0);
                }
                else {
                  puVar4 = p->puTemp1;
                  puVar5 = p->puTemp4;
                  uVar18 = uVar11;
                  do {
                    if ((int)uVar18 < 1) {
                      pIsfR->uUniq = pIsfR->uUniq | uVar19;
                      uVar8 = uVar8 + 1;
                      if (0 < iVar10) {
                        puVar16 = p->puTemp2;
                        uVar11 = uVar11 + 1;
                        do {
                          puVar16[uVar11 - 2] = puVar5[uVar11 - 2];
                          uVar11 = uVar11 - 1;
                        } while (1 < uVar11);
                      }
                      goto LAB_0054e1be;
                    }
                    lVar15 = uVar18 - 1;
                    lVar6 = uVar18 - 1;
                    lVar7 = uVar18 - 1;
                    uVar18 = uVar18 - 1;
                  } while ((puVar4[lVar7] & puVar5[lVar15] & puVar16[lVar6]) == 0);
                  puVar5 = p->puTemp3;
                  uVar18 = uVar11;
                  do {
                    if ((int)uVar18 < 1) {
                      pIsfL->uUniq = pIsfL->uUniq | uVar19;
                      uVar9 = uVar9 + 1;
                      if (0 < iVar10) {
                        uVar11 = uVar11 + 1;
                        do {
                          puVar4[uVar11 - 2] = puVar5[uVar11 - 2];
                          uVar11 = uVar11 - 1;
                        } while (1 < uVar11);
                      }
                      break;
                    }
                    lVar15 = uVar18 - 1;
                    lVar6 = uVar18 - 1;
                    lVar7 = uVar18 - 1;
                    uVar18 = uVar18 - 1;
                  } while ((p->puTemp2[lVar7] & puVar5[lVar15] & puVar16[lVar6]) == 0);
                }
              }
LAB_0054e1be:
              iVar = iVar + 1;
              iVar10 = p->nVars;
            } while ((int)iVar < iVar10);
          }
          puVar16 = pIsfL->puOn;
          uVar14 = 1 << ((char)iVar10 - 5U & 0x1f);
          if (iVar10 < 6) {
            uVar14 = 1;
          }
          if (0 < (int)uVar14) {
            puVar4 = pIsf->puOn;
            puVar5 = p->puTemp1;
            uVar11 = (ulong)uVar14 + 1;
            do {
              puVar16[uVar11 - 2] = puVar5[uVar11 - 2] & puVar4[uVar11 - 2];
              uVar11 = uVar11 - 1;
            } while (1 < uVar11);
            iVar10 = p->nVars;
          }
          Kit_TruthExistSet(puVar16,puVar16,iVar10,pIsfR->uUniq);
          puVar16 = pIsfL->puOff;
          puVar4 = p->puTemp2;
          iVar10 = p->nVars;
          uVar14 = 1 << ((char)iVar10 - 5U & 0x1f);
          uVar12 = uVar14;
          if (iVar10 < 6) {
            uVar12 = 1;
          }
          if (0 < (int)uVar12) {
            uVar11 = (ulong)uVar12 + 1;
            do {
              puVar16[uVar11 - 2] = puVar4[uVar11 - 2];
              uVar11 = uVar11 - 1;
            } while (1 < uVar11);
            iVar10 = p->nVars;
            uVar14 = 1 << ((char)iVar10 - 5U & 0x1f);
          }
          if (iVar10 < 6) {
            uVar14 = 1;
          }
          uVar18 = (ulong)uVar14;
          uVar11 = uVar18;
          do {
            if ((int)uVar11 < 1) {
              __assert_fail("!Kit_TruthIsConst0(pIsfL->puOn, p->nVars)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                            ,0x19a,
                            "int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                           );
            }
            lVar15 = uVar11 - 1;
            uVar11 = uVar11 - 1;
            uVar13 = uVar18;
          } while (pIsfL->puOn[lVar15] == 0);
          do {
            if ((int)uVar13 < 1) {
              __assert_fail("!Kit_TruthIsConst0(pIsfL->puOff, p->nVars)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                            ,0x19b,
                            "int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                           );
            }
            lVar15 = uVar13 - 1;
            uVar13 = uVar13 - 1;
          } while (puVar16[lVar15] == 0);
          puVar16 = pIsfR->puOn;
          if (0 < (int)uVar14) {
            puVar5 = pIsf->puOn;
            uVar18 = uVar18 + 1;
            do {
              puVar16[uVar18 - 2] = puVar4[uVar18 - 2] & puVar5[uVar18 - 2];
              uVar18 = uVar18 - 1;
            } while (1 < uVar18);
            iVar10 = p->nVars;
          }
          Kit_TruthExistSet(puVar16,puVar16,iVar10,pIsfL->uUniq);
          puVar16 = pIsfR->puOff;
          iVar10 = p->nVars;
          uVar14 = 1 << ((char)iVar10 - 5U & 0x1f);
          uVar12 = uVar14;
          if (iVar10 < 6) {
            uVar12 = 1;
          }
          if (0 < (int)uVar12) {
            puVar4 = p->puTemp1;
            uVar11 = (ulong)uVar12 + 1;
            do {
              puVar16[uVar11 - 2] = puVar4[uVar11 - 2];
              uVar11 = uVar11 - 1;
            } while (1 < uVar11);
            iVar10 = p->nVars;
            uVar14 = 1 << ((char)iVar10 - 5U & 0x1f);
          }
          if (iVar10 < 6) {
            uVar14 = 1;
          }
          uVar18 = (ulong)uVar14;
          uVar11 = uVar18;
          do {
            if ((int)uVar11 < 1) {
              __assert_fail("!Kit_TruthIsConst0(pIsfR->puOn, p->nVars)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                            ,0x1a8,
                            "int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                           );
            }
            lVar15 = uVar11 - 1;
            uVar11 = uVar11 - 1;
          } while (pIsfR->puOn[lVar15] == 0);
          do {
            if ((int)uVar18 < 1) {
              __assert_fail("!Kit_TruthIsConst0(pIsfR->puOff, p->nVars)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                            ,0x1a9,
                            "int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                           );
            }
            lVar15 = uVar18 - 1;
            uVar18 = uVar18 - 1;
          } while (puVar16[lVar15] == 0);
          if (pIsfL->uUniq == 0) {
            __assert_fail("pIsfL->uUniq",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                          ,0x1ac,
                          "int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)")
            ;
          }
          if (pIsfR->uUniq == 0) {
            __assert_fail("pIsfR->uUniq",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                          ,0x1ad,
                          "int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)")
            ;
          }
          if ((int)uVar9 < 1) {
            __assert_fail("nLeftVars > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                          ,0xbc,"int Bdc_DecomposeGetCost(Bdc_Man_t *, int, int)");
          }
          if ((int)uVar8 < 1) {
            __assert_fail("nRightVars > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                          ,0xbd,"int Bdc_DecomposeGetCost(Bdc_Man_t *, int, int)");
          }
          uVar14 = uVar8;
          if (uVar9 < uVar8) {
            uVar14 = uVar9;
          }
          if (uVar8 < uVar9) {
            uVar8 = uVar9;
          }
          return (iVar10 * uVar14 + uVar8) * 1000;
        }
        pIsfR->puOff = (uint *)0x0;
      }
      goto LAB_0054e4a0;
    }
  }
  pIsfL->puOff = (uint *)0x0;
LAB_0054e4a0:
  __assert_fail("pF->puOff && pF->puOn",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcInt.h"
                ,0x83,"void Bdc_IsfStart(Bdc_Man_t *, Bdc_Isf_t *)");
}

Assistant:

int Bdc_DecomposeOr( Bdc_Man_t * p, Bdc_Isf_t * pIsf, Bdc_Isf_t * pIsfL, Bdc_Isf_t * pIsfR )
{
    unsigned uSupportRem;
	int v, nLeftVars = 1, nRightVars = 1; 
    // clean the var sets
    Bdc_IsfStart( p, pIsfL );
    Bdc_IsfStart( p, pIsfR );
    // check that the support is correct
    assert( Kit_TruthSupport(pIsf->puOn, p->nVars) == Kit_TruthSupport(pIsf->puOff, p->nVars) );
    assert( pIsf->uSupp == Kit_TruthSupport(pIsf->puOn, p->nVars) );
    // find initial variable sets
    if ( !Bdc_DecomposeFindInitialVarSet( p, pIsf, pIsfL, pIsfR ) )
        return Bdc_DecomposeWeakOr( p, pIsf, pIsfL, pIsfR );
    // prequantify the variables in the offset
    Kit_TruthExistSet( p->puTemp1, pIsf->puOff, p->nVars, pIsfL->uUniq ); 
    Kit_TruthExistSet( p->puTemp2, pIsf->puOff, p->nVars, pIsfR->uUniq );
    // go through the remaining variables
    uSupportRem = pIsf->uSupp & ~pIsfL->uUniq & ~pIsfR->uUniq;
    for ( v = 0; v < p->nVars; v++ )
    {
        if ( (uSupportRem & (1 << v)) == 0 )
            continue;
        // prequantify this variable
        Kit_TruthExistNew( p->puTemp3, p->puTemp1, p->nVars, v );
        Kit_TruthExistNew( p->puTemp4, p->puTemp2, p->nVars, v );
		if ( nLeftVars < nRightVars )
		{
//			if ( (Q & bdd_exist( pF->R, pL->V & VarNew ) & bdd_exist( pF->R, pR->V )) == bddfalse )
//			if ( VerifyORCondition( dd, pF->Q, pF->R, pL->V, pR->V, VarNew ) )
			if ( Kit_TruthIsDisjoint3(pIsf->puOn, p->puTemp3, p->puTemp2, p->nVars) )
			{
//				pL->V &= VarNew;
                pIsfL->uUniq |= (1 << v);
				nLeftVars++;
                Kit_TruthCopy( p->puTemp1, p->puTemp3, p->nVars );
			}
//			else if ( (Q & bdd_exist( pF->R, pR->V & VarNew ) & bdd_exist( pF->R, pL->V )) == bddfalse )
			else if ( Kit_TruthIsDisjoint3(pIsf->puOn, p->puTemp4, p->puTemp1, p->nVars) )
			{
//				pR->V &= VarNew;
                pIsfR->uUniq |= (1 << v);
				nRightVars++;
                Kit_TruthCopy( p->puTemp2, p->puTemp4, p->nVars );
			}
		}
		else
		{
//			if ( (Q & bdd_exist( pF->R, pR->V & VarNew ) & bdd_exist( pF->R, pL->V )) == bddfalse )
			if ( Kit_TruthIsDisjoint3(pIsf->puOn, p->puTemp4, p->puTemp1, p->nVars) )
			{
//				pR->V &= VarNew;
                pIsfR->uUniq |= (1 << v);
				nRightVars++;
                Kit_TruthCopy( p->puTemp2, p->puTemp4, p->nVars );
			}
//			else if ( (Q & bdd_exist( pF->R, pL->V & VarNew ) & bdd_exist( pF->R, pR->V )) == bddfalse )
			else if ( Kit_TruthIsDisjoint3(pIsf->puOn, p->puTemp3, p->puTemp2, p->nVars) )
			{
//				pL->V &= VarNew;
                pIsfL->uUniq |= (1 << v);
				nLeftVars++;
                Kit_TruthCopy( p->puTemp1, p->puTemp3, p->nVars );
			}
		}
    }

	// derive the functions Q and R for the left branch
//	pL->Q = bdd_appex( pF->Q, bdd_exist( pF->R, pL->V ), bddop_and, pR->V );
//	pL->R = bdd_exist( pF->R, pR->V );

//	Temp = Cudd_bddExistAbstract( dd, pF->R, pL->V );      Cudd_Ref( Temp );
//	pL->Q = Cudd_bddAndAbstract( dd, pF->Q, Temp, pR->V ); Cudd_Ref( pL->Q );
//	Cudd_RecursiveDeref( dd, Temp );
//	pL->R = Cudd_bddExistAbstract( dd, pF->R, pR->V );     Cudd_Ref( pL->R );

    Kit_TruthAnd( pIsfL->puOn, pIsf->puOn, p->puTemp1, p->nVars );
    Kit_TruthExistSet( pIsfL->puOn, pIsfL->puOn, p->nVars, pIsfR->uUniq );
    Kit_TruthCopy( pIsfL->puOff, p->puTemp2, p->nVars );

//	assert( pL->Q != b0 );
//	assert( pL->R != b0 );
//	assert( Cudd_bddIteConstant( dd, pL->Q, pL->R, b0 ) == b0 );
    assert( !Kit_TruthIsConst0(pIsfL->puOn, p->nVars) );
    assert( !Kit_TruthIsConst0(pIsfL->puOff, p->nVars) );
//    assert( Kit_TruthIsDisjoint(pIsfL->puOn, pIsfL->puOff, p->nVars) );

	// derive the functions Q and R for the right branch
//	Temp = Cudd_bddExistAbstract( dd, pF->R, pR->V );      Cudd_Ref( Temp );
//	pR->Q = Cudd_bddAndAbstract( dd, pF->Q, Temp, pL->V ); Cudd_Ref( pR->Q );
//	Cudd_RecursiveDeref( dd, Temp );
//	pR->R = Cudd_bddExistAbstract( dd, pF->R, pL->V );     Cudd_Ref( pR->R );

    Kit_TruthAnd( pIsfR->puOn, pIsf->puOn, p->puTemp2, p->nVars );
    Kit_TruthExistSet( pIsfR->puOn, pIsfR->puOn, p->nVars, pIsfL->uUniq );
    Kit_TruthCopy( pIsfR->puOff, p->puTemp1, p->nVars );

    assert( !Kit_TruthIsConst0(pIsfR->puOn, p->nVars) );
    assert( !Kit_TruthIsConst0(pIsfR->puOff, p->nVars) );
//    assert( Kit_TruthIsDisjoint(pIsfR->puOn, pIsfR->puOff, p->nVars) );

    assert( pIsfL->uUniq );
    assert( pIsfR->uUniq );
	return Bdc_DecomposeGetCost( p, nLeftVars, nRightVars );		
}